

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HgtFilesGrid.cpp
# Opt level: O0

void __thiscall HgtFilesGrid::Init(HgtFilesGrid *this,int maxLoadedFiles,char *filesPath)

{
  undefined1 auVar1 [16];
  undefined7 uVar2;
  int iVar3;
  ulong uVar4;
  Heights *pHVar5;
  char *pcVar6;
  ostream *poVar7;
  char *__src;
  FileFlag (*paFVar8) [361];
  long lVar9;
  int local_80;
  int i_2;
  int length;
  char demFileName [12];
  allocator<char> local_59;
  string local_58 [8];
  string fileName;
  FILE *fp;
  int local_28;
  int j;
  int i_1;
  int i;
  char *filesPath_local;
  int maxLoadedFiles_local;
  HgtFilesGrid *this_local;
  
  this->loadedFiles = 0;
  this->MAX_LOADED_FILES = maxLoadedFiles;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)maxLoadedFiles;
  uVar4 = SUB168(auVar1 * ZEXT816(0x2c04d0),0);
  if (SUB168(auVar1 * ZEXT816(0x2c04d0),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pHVar5 = (Heights *)operator_new__(uVar4);
  this->dataStack = pHVar5;
  for (j = 0; j < maxLoadedFiles; j = j + 1) {
    this->dataStack[j].pFileFlag = (FileFlag *)0x0;
  }
  for (local_28 = 0; local_28 < 0xb5; local_28 = local_28 + 1) {
    for (fp._4_4_ = 0; fp._4_4_ < 0x169; fp._4_4_ = fp._4_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_58,filesPath,&local_59);
      std::allocator<char>::~allocator(&local_59);
      HgtFormat::crdtodem((double)(0x5a - local_28),(double)(fp._4_4_ + -0xb4),(char *)&i_2);
      std::__cxx11::string::append((char *)local_58);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      fileName.field_2._8_8_ = fopen(pcVar6,"rb");
      if ((FILE *)fileName.field_2._8_8_ == (FILE *)0x0) {
        this->hgtFilesGrid[local_28][fp._4_4_].fileName = (char *)0x0;
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,"loaded: ");
        poVar7 = std::operator<<(poVar7,local_58);
        std::operator<<(poVar7,"\n");
        iVar3 = std::__cxx11::string::length();
        pcVar6 = (char *)operator_new__((long)(iVar3 + 1));
        this->hgtFilesGrid[local_28][fp._4_4_].fileName = pcVar6;
        pcVar6 = this->hgtFilesGrid[local_28][fp._4_4_].fileName;
        __src = (char *)std::__cxx11::string::c_str();
        strcpy(pcVar6,__src);
        fclose((FILE *)fileName.field_2._8_8_);
      }
      this->hgtFilesGrid[local_28][fp._4_4_].pHeightData = (Heights *)0x0;
      this->hgtFilesGrid[local_28][fp._4_4_].isLoaded = false;
      std::__cxx11::string::~string(local_58);
    }
  }
  for (local_80 = 0; local_80 < 0xb5; local_80 = local_80 + 1) {
    paFVar8 = this->hgtFilesGrid + local_80;
    lVar9 = (long)local_80;
    this->hgtFilesGrid[lVar9][0x168].fileName = (*paFVar8)[0].fileName;
    uVar2 = *(undefined7 *)&((FileFlag *)((long)paFVar8 + 0))->field_0x9;
    ((FileFlag *)((long)(this->hgtFilesGrid + lVar9) + 0x21c0))->isLoaded =
         ((FileFlag *)((long)paFVar8 + 0))->isLoaded;
    *(undefined7 *)&((FileFlag *)((long)(this->hgtFilesGrid + lVar9) + 0x21c0))->field_0x9 = uVar2;
    this->hgtFilesGrid[lVar9][0x168].pHeightData = (*paFVar8)[0].pHeightData;
  }
  return;
}

Assistant:

void HgtFilesGrid::Init( int maxLoadedFiles, const char* filesPath )
{
	this->loadedFiles = 0;
	this->MAX_LOADED_FILES = maxLoadedFiles;
	this->dataStack = new Heights[maxLoadedFiles];
	for( int i = 0; i < maxLoadedFiles; i++ )
		this->dataStack[i].pFileFlag = NULL;

	for( int i = 0; i <= 180; i++ ){
		for( int j = 0; j <= 360; j++ ){
			FILE *fp;
			std::string fileName(filesPath);
			char demFileName[12];
			fileName.append(HgtFormat::crdtodem(90 - i, -180 + j, demFileName));
            fp = fopen(fileName.c_str(), "rb");
            
			if( fp == NULL ) {
				
				this->hgtFilesGrid[i][j].fileName = NULL;
			} else {
				std::cout << "loaded: " << fileName << "\n";
				int length = fileName.length();
				this->hgtFilesGrid[i][j].fileName = new char[length + 1];
                strcpy(hgtFilesGrid[i][j].fileName, fileName.c_str());
                
				//strcpy_s( hgtFilesGrid[i][j].fileName, length + 1, fileName.c_str() );
				fclose(fp);
			}
			this->hgtFilesGrid[i][j].pHeightData = NULL;
			this->hgtFilesGrid[i][j].isLoaded = false;
		}
	}

	for( int i = 0; i <= 180; i++ ){
		this->hgtFilesGrid[i][360] = this->hgtFilesGrid[i][0];
	}
}